

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_heap_ptr<mjs::global_object_impl> __thiscall
mjs::gc_heap::allocate_and_construct<mjs::global_object_impl,mjs::gc_heap&,mjs::version&,bool&>
          (gc_heap *this,size_t num_bytes,gc_heap *args,version *args_1,bool *args_2)

{
  slot *this_00;
  undefined8 extraout_RDX;
  bool *in_R9;
  allocation_result aVar1;
  gc_heap_ptr<mjs::global_object_impl> gVar2;
  
  aVar1 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  this_00 = aVar1.obj;
  if (*(int *)((long)this_00 + -4) == -1) {
    global_object_impl::global_object_impl
              ((global_object_impl *)&this_00->allocation,(gc_heap *)args_1,*(version *)args_2,in_R9
              );
    *(undefined4 *)((long)this_00 + -4) =
         gc_type_info_registration<mjs::global_object_impl>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar1.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar2.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::global_object_impl>)gVar2.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::global_object_impl, Args = <mjs::gc_heap &, mjs::version &, bool &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}